

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O3

bool wasm::Debug::hasDWARFSections(Module *wasm)

{
  pointer pCVar1;
  bool bVar2;
  undefined1 in_CL;
  CustomSection *section;
  pointer pCVar3;
  string_view s;
  string_view local_38;
  
  pCVar3 = (wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar3 == pCVar1) {
    bVar2 = false;
  }
  else {
    do {
      s._M_str = (char *)0x0;
      s._M_len = (size_t)(pCVar3->name)._M_dataplus._M_p;
      local_38 = IString::interned((IString *)(pCVar3->name)._M_string_length,s,(bool)in_CL);
      bVar2 = IString::startsWith<8>((IString *)&local_38,(char (*) [8])".debug_");
      if (bVar2) {
        return bVar2;
      }
      pCVar3 = pCVar3 + 1;
    } while (pCVar3 != pCVar1);
  }
  return bVar2;
}

Assistant:

bool hasDWARFSections(const Module& wasm) {
  for (auto& section : wasm.customSections) {
    if (isDWARFSection(section.name)) {
      return true;
    }
  }
  return false;
}